

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraint.cpp
# Opt level: O1

btScalar __thiscall
btMultiBodyConstraint::fillMultiBodyConstraint
          (btMultiBodyConstraint *this,btMultiBodySolverConstraint *solverConstraint,
          btMultiBodyJacobianData *data,btScalar *jacOrgA,btScalar *jacOrgB,
          btVector3 *contactNormalOnB,btVector3 *posAworld,btVector3 *posBworld,btScalar posError,
          btContactSolverInfo *infoGlobal,btScalar lowerLimit,btScalar upperLimit,
          btScalar relaxation,bool isFriction,btScalar desiredVelocity,btScalar cfmSlip)

{
  btScalar *pbVar1;
  undefined8 uVar2;
  int iVar3;
  btMultiBody *this_00;
  btMultiBody *this_01;
  btMultibodyLink *pbVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  btVector3 *pbVar11;
  int iVar12;
  int iVar13;
  float *pfVar14;
  long lVar15;
  btSolverBody *pbVar16;
  btSolverBody *pbVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  btRigidBody *pbVar21;
  uint uVar22;
  ulong uVar23;
  int curSize;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  btScalar bVar30;
  float fVar31;
  float fVar32;
  btScalar bVar33;
  float in_XMM9_Da;
  btRigidBody *local_118;
  undefined8 local_a8;
  undefined8 local_98;
  btVector3 local_58;
  btVector3 local_40;
  
  this_00 = this->m_bodyA;
  solverConstraint->m_multiBodyA = this_00;
  this_01 = this->m_bodyB;
  solverConstraint->m_multiBodyB = this_01;
  uVar22 = this->m_linkA;
  solverConstraint->m_linkA = uVar22;
  solverConstraint->m_linkB = this->m_linkB;
  if (this_00 == (btMultiBody *)0x0) {
    pbVar17 = data->m_solverBodyPool->m_data + solverConstraint->m_solverBodyIdA;
  }
  else {
    pbVar17 = (btSolverBody *)0x0;
  }
  if (this_01 == (btMultiBody *)0x0) {
    pbVar16 = data->m_solverBodyPool->m_data + solverConstraint->m_solverBodyIdB;
  }
  else {
    pbVar16 = (btSolverBody *)0x0;
  }
  if (this_00 == (btMultiBody *)0x0) {
    local_118 = pbVar17->m_originalBody;
  }
  else {
    local_118 = (btRigidBody *)0x0;
  }
  if (this_01 == (btMultiBody *)0x0) {
    pbVar21 = pbVar16->m_originalBody;
  }
  else {
    pbVar21 = (btRigidBody *)0x0;
  }
  fVar25 = desiredVelocity;
  if (pbVar17 != (btSolverBody *)0x0) {
    uVar2 = *(undefined8 *)(pbVar17->m_worldTransform).m_origin.m_floats;
    local_a8 = CONCAT44((float)((ulong)*(undefined8 *)posAworld->m_floats >> 0x20) -
                        (float)((ulong)uVar2 >> 0x20),
                        (float)*(undefined8 *)posAworld->m_floats - (float)uVar2);
    fVar25 = posAworld->m_floats[2] - (pbVar17->m_worldTransform).m_origin.m_floats[2];
  }
  if (pbVar16 != (btSolverBody *)0x0) {
    uVar2 = *(undefined8 *)(pbVar16->m_worldTransform).m_origin.m_floats;
    local_98 = CONCAT44((float)((ulong)*(undefined8 *)posBworld->m_floats >> 0x20) -
                        (float)((ulong)uVar2 >> 0x20),
                        (float)*(undefined8 *)posBworld->m_floats - (float)uVar2);
    in_XMM9_Da = posBworld->m_floats[2] - (pbVar16->m_worldTransform).m_origin.m_floats[2];
  }
  if (this_00 == (btMultiBody *)0x0) {
    fVar28 = (float)*(undefined8 *)(contactNormalOnB->m_floats + 1);
    fVar27 = (float)((ulong)*(undefined8 *)(contactNormalOnB->m_floats + 1) >> 0x20);
    fVar26 = fVar27 * local_a8._4_4_ - fVar25 * fVar28;
    fVar27 = contactNormalOnB->m_floats[0] * fVar25 - (float)local_a8 * fVar27;
    fVar28 = fVar28 * (float)local_a8 - local_a8._4_4_ * contactNormalOnB->m_floats[0];
    fVar29 = 0.0;
    fVar31 = 0.0;
    fVar32 = 0.0;
    if (local_118 != (btRigidBody *)0x0) {
      uVar2 = *(undefined8 *)(local_118->m_angularFactor).m_floats;
      fVar29 = (float)uVar2 *
               (fVar28 * *(float *)&local_118->field_0x154 +
               fVar26 * *(float *)&(local_118->super_btCollisionObject).field_0x14c +
               *(float *)&local_118->field_0x150 * fVar27);
      fVar31 = (float)((ulong)uVar2 >> 0x20) *
               (fVar28 * *(float *)&local_118->field_0x164 +
               fVar26 * *(float *)&local_118->field_0x15c +
               *(float *)&local_118->field_0x160 * fVar27);
      fVar32 = (*(float *)&local_118->field_0x174 * fVar28 +
               *(float *)&local_118->field_0x16c * fVar26 +
               *(float *)&local_118->field_0x170 * fVar27) *
               (local_118->m_angularFactor).m_floats[2];
    }
    auVar10._4_4_ = fVar31;
    auVar10._0_4_ = fVar29;
    auVar10._8_4_ = fVar32;
    auVar10._12_4_ = 0;
    *(undefined1 (*) [16])(solverConstraint->m_angularComponentA).m_floats = auVar10;
  }
  else {
    if ((int)uVar22 < 0) {
      uVar2 = *(undefined8 *)(this_00->m_basePos).m_floats;
      local_a8 = CONCAT44((float)((ulong)*(undefined8 *)posAworld->m_floats >> 0x20) -
                          (float)((ulong)uVar2 >> 0x20),
                          (float)*(undefined8 *)posAworld->m_floats - (float)uVar2);
      pbVar11 = (btVector3 *)(this_00->m_basePos).m_floats;
    }
    else {
      pbVar4 = (this_00->m_links).m_data;
      pbVar11 = &pbVar4[uVar22].m_cachedWorldTransform.m_origin;
      uVar2 = *(undefined8 *)pbVar4[uVar22].m_cachedWorldTransform.m_origin.m_floats;
      local_a8 = CONCAT44((float)((ulong)*(undefined8 *)posAworld->m_floats >> 0x20) -
                          (float)((ulong)uVar2 >> 0x20),
                          (float)*(undefined8 *)posAworld->m_floats - (float)uVar2);
    }
    fVar25 = posAworld->m_floats[2] - pbVar11->m_floats[2];
    iVar13 = this_00->m_companionId;
    iVar3 = this_00->m_dofCount;
    uVar22 = iVar3 + 6;
    solverConstraint->m_deltaVelAindex = iVar13;
    if (iVar13 < 0) {
      iVar13 = (data->m_deltaVelocities).m_size;
      solverConstraint->m_deltaVelAindex = iVar13;
      this_00->m_companionId = iVar13;
      iVar12 = uVar22 + iVar13;
      if ((-7 < iVar3) && (iVar3 != -6)) {
        if ((data->m_deltaVelocities).m_capacity < iVar12) {
          if (iVar12 == 0) {
            pfVar14 = (float *)0x0;
          }
          else {
            pfVar14 = (float *)btAlignedAllocInternal((long)iVar12 << 2,0x10);
          }
          lVar15 = (long)(data->m_deltaVelocities).m_size;
          if (0 < lVar15) {
            pfVar5 = (data->m_deltaVelocities).m_data;
            lVar18 = 0;
            do {
              pfVar14[lVar18] = pfVar5[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar15 != lVar18);
          }
          pfVar5 = (data->m_deltaVelocities).m_data;
          if (pfVar5 != (float *)0x0) {
            if ((data->m_deltaVelocities).m_ownsMemory == true) {
              btAlignedFreeInternal(pfVar5);
            }
            (data->m_deltaVelocities).m_data = (float *)0x0;
          }
          (data->m_deltaVelocities).m_ownsMemory = true;
          (data->m_deltaVelocities).m_data = pfVar14;
          (data->m_deltaVelocities).m_capacity = iVar12;
        }
        if (iVar3 != -6) {
          memset((data->m_deltaVelocities).m_data + iVar13,0,((long)iVar12 - (long)iVar13) * 4);
        }
      }
      (data->m_deltaVelocities).m_size = iVar12;
    }
    iVar13 = (data->m_jacobians).m_size;
    solverConstraint->m_jacAindex = iVar13;
    iVar12 = iVar13 + uVar22;
    if ((-7 < iVar3) && (iVar3 != -6)) {
      if ((data->m_jacobians).m_capacity < iVar12) {
        if (iVar12 == 0) {
          pfVar14 = (float *)0x0;
        }
        else {
          pfVar14 = (float *)btAlignedAllocInternal((long)iVar12 << 2,0x10);
        }
        lVar15 = (long)(data->m_jacobians).m_size;
        if (0 < lVar15) {
          pfVar5 = (data->m_jacobians).m_data;
          lVar18 = 0;
          do {
            pfVar14[lVar18] = pfVar5[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar15 != lVar18);
        }
        pfVar5 = (data->m_jacobians).m_data;
        if (pfVar5 != (float *)0x0) {
          if ((data->m_jacobians).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar5);
          }
          (data->m_jacobians).m_data = (float *)0x0;
        }
        (data->m_jacobians).m_ownsMemory = true;
        (data->m_jacobians).m_data = pfVar14;
        (data->m_jacobians).m_capacity = iVar12;
      }
      if (iVar3 != -6) {
        memset((data->m_jacobians).m_data + iVar13,0,((long)iVar12 - (long)iVar13) * 4);
      }
    }
    (data->m_jacobians).m_size = iVar12;
    if (jacOrgA == (btScalar *)0x0) {
      local_58.m_floats[0] = 0.0;
      local_58.m_floats[1] = 0.0;
      local_58.m_floats[2] = 0.0;
      local_58.m_floats[3] = 0.0;
      btMultiBody::fillConstraintJacobianMultiDof
                (this_00,solverConstraint->m_linkA,posAworld,&local_58,contactNormalOnB,
                 (data->m_jacobians).m_data + solverConstraint->m_jacAindex,&data->scratch_r,
                 &data->scratch_v,&data->scratch_m);
    }
    else if (-6 < iVar3) {
      iVar13 = solverConstraint->m_jacAindex;
      uVar23 = 1;
      if (1 < (int)uVar22) {
        uVar23 = (ulong)uVar22;
      }
      pfVar14 = (data->m_jacobians).m_data;
      uVar19 = 0;
      do {
        pfVar14[(long)iVar13 + uVar19] = jacOrgA[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar23 != uVar19);
    }
    lVar15 = (long)(data->m_deltaVelocitiesUnitImpulse).m_size;
    iVar13 = (int)((int)uVar22 + lVar15);
    if ((-7 < iVar3) && (iVar3 != -6)) {
      if ((data->m_deltaVelocitiesUnitImpulse).m_capacity < iVar13) {
        if (iVar13 == 0) {
          pfVar14 = (float *)0x0;
        }
        else {
          pfVar14 = (float *)btAlignedAllocInternal(((int)uVar22 + lVar15) * 4,0x10);
        }
        lVar18 = (long)(data->m_deltaVelocitiesUnitImpulse).m_size;
        if (0 < lVar18) {
          pfVar5 = (data->m_deltaVelocitiesUnitImpulse).m_data;
          lVar20 = 0;
          do {
            pfVar14[lVar20] = pfVar5[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar18 != lVar20);
        }
        pfVar5 = (data->m_deltaVelocitiesUnitImpulse).m_data;
        if (pfVar5 != (float *)0x0) {
          if ((data->m_deltaVelocitiesUnitImpulse).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar5);
          }
          (data->m_deltaVelocitiesUnitImpulse).m_data = (float *)0x0;
        }
        (data->m_deltaVelocitiesUnitImpulse).m_ownsMemory = true;
        (data->m_deltaVelocitiesUnitImpulse).m_data = pfVar14;
        (data->m_deltaVelocitiesUnitImpulse).m_capacity = iVar13;
      }
      if (iVar3 != -6) {
        memset((data->m_deltaVelocitiesUnitImpulse).m_data + lVar15,0,(iVar13 - lVar15) * 4);
      }
    }
    (data->m_deltaVelocitiesUnitImpulse).m_size = iVar13;
    btMultiBody::calcAccelerationDeltasMultiDof
              (this_00,(data->m_jacobians).m_data + solverConstraint->m_jacAindex,
               (data->m_deltaVelocitiesUnitImpulse).m_data + solverConstraint->m_jacAindex,
               &data->scratch_r,&data->scratch_v);
    fVar28 = (float)*(undefined8 *)(contactNormalOnB->m_floats + 1);
    fVar27 = (float)((ulong)*(undefined8 *)(contactNormalOnB->m_floats + 1) >> 0x20);
    fVar26 = fVar27 * local_a8._4_4_ - fVar25 * fVar28;
    fVar27 = contactNormalOnB->m_floats[0] * fVar25 - (float)local_a8 * fVar27;
    fVar28 = fVar28 * (float)local_a8 - local_a8._4_4_ * contactNormalOnB->m_floats[0];
  }
  auVar6._4_4_ = fVar27;
  auVar6._0_4_ = fVar26;
  auVar6._8_4_ = fVar28;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar6;
  uVar2 = *(undefined8 *)(contactNormalOnB->m_floats + 2);
  *(undefined8 *)(solverConstraint->m_contactNormal1).m_floats =
       *(undefined8 *)contactNormalOnB->m_floats;
  *(undefined8 *)((solverConstraint->m_contactNormal1).m_floats + 2) = uVar2;
  if (this_01 == (btMultiBody *)0x0) {
    fVar28 = (float)*(undefined8 *)contactNormalOnB->m_floats;
    fVar32 = (float)((ulong)*(undefined8 *)contactNormalOnB->m_floats >> 0x20);
    fVar26 = local_98._4_4_ * contactNormalOnB->m_floats[2] - fVar32 * in_XMM9_Da;
    fVar27 = in_XMM9_Da * fVar28 - contactNormalOnB->m_floats[2] * (float)local_98;
    fVar28 = (float)local_98 * fVar32 - fVar28 * local_98._4_4_;
    if (pbVar21 == (btRigidBody *)0x0) {
      fVar29 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
    }
    else {
      fVar32 = -fVar26;
      uVar2 = *(undefined8 *)(pbVar21->m_angularFactor).m_floats;
      fVar29 = (float)uVar2 *
               ((fVar32 * *(float *)&(pbVar21->super_btCollisionObject).field_0x14c -
                fVar27 * *(float *)&pbVar21->field_0x150) - *(float *)&pbVar21->field_0x154 * fVar28
               );
      fVar31 = (float)((ulong)uVar2 >> 0x20) *
               ((fVar32 * *(float *)&pbVar21->field_0x15c - fVar27 * *(float *)&pbVar21->field_0x160
                ) - *(float *)&pbVar21->field_0x164 * fVar28);
      fVar32 = ((*(float *)&pbVar21->field_0x16c * fVar32 - *(float *)&pbVar21->field_0x170 * fVar27
                ) - *(float *)&pbVar21->field_0x174 * fVar28) *
               (pbVar21->m_angularFactor).m_floats[2];
    }
    auVar9._4_4_ = fVar31;
    auVar9._0_4_ = fVar29;
    auVar9._8_4_ = fVar32;
    auVar9._12_4_ = 0;
    *(undefined1 (*) [16])(solverConstraint->m_angularComponentB).m_floats = auVar9;
  }
  else {
    lVar15 = (long)solverConstraint->m_linkB;
    if (lVar15 < 0) {
      uVar2 = *(undefined8 *)(this_01->m_basePos).m_floats;
      local_98 = CONCAT44((float)((ulong)*(undefined8 *)posBworld->m_floats >> 0x20) -
                          (float)((ulong)uVar2 >> 0x20),
                          (float)*(undefined8 *)posBworld->m_floats - (float)uVar2);
      pbVar11 = (btVector3 *)(this_01->m_basePos).m_floats;
    }
    else {
      pbVar4 = (this_01->m_links).m_data;
      pbVar11 = &pbVar4[lVar15].m_cachedWorldTransform.m_origin;
      uVar2 = *(undefined8 *)pbVar4[lVar15].m_cachedWorldTransform.m_origin.m_floats;
      local_98 = CONCAT44((float)((ulong)*(undefined8 *)posBworld->m_floats >> 0x20) -
                          (float)((ulong)uVar2 >> 0x20),
                          (float)*(undefined8 *)posBworld->m_floats - (float)uVar2);
    }
    in_XMM9_Da = posBworld->m_floats[2] - pbVar11->m_floats[2];
    iVar13 = this_01->m_companionId;
    iVar3 = this_01->m_dofCount;
    uVar22 = iVar3 + 6;
    solverConstraint->m_deltaVelBindex = iVar13;
    if (iVar13 < 0) {
      iVar13 = (data->m_deltaVelocities).m_size;
      solverConstraint->m_deltaVelBindex = iVar13;
      this_01->m_companionId = iVar13;
      iVar12 = uVar22 + iVar13;
      if ((-7 < iVar3) && (iVar3 != -6)) {
        if ((data->m_deltaVelocities).m_capacity < iVar12) {
          if (iVar12 == 0) {
            pfVar14 = (float *)0x0;
          }
          else {
            pfVar14 = (float *)btAlignedAllocInternal((long)iVar12 << 2,0x10);
          }
          lVar15 = (long)(data->m_deltaVelocities).m_size;
          if (0 < lVar15) {
            pfVar5 = (data->m_deltaVelocities).m_data;
            lVar18 = 0;
            do {
              pfVar14[lVar18] = pfVar5[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar15 != lVar18);
          }
          pfVar5 = (data->m_deltaVelocities).m_data;
          if (pfVar5 != (float *)0x0) {
            if ((data->m_deltaVelocities).m_ownsMemory == true) {
              btAlignedFreeInternal(pfVar5);
            }
            (data->m_deltaVelocities).m_data = (float *)0x0;
          }
          (data->m_deltaVelocities).m_ownsMemory = true;
          (data->m_deltaVelocities).m_data = pfVar14;
          (data->m_deltaVelocities).m_capacity = iVar12;
        }
        if (iVar3 != -6) {
          memset((data->m_deltaVelocities).m_data + iVar13,0,((long)iVar12 - (long)iVar13) * 4);
        }
      }
      (data->m_deltaVelocities).m_size = iVar12;
    }
    iVar13 = (data->m_jacobians).m_size;
    solverConstraint->m_jacBindex = iVar13;
    iVar12 = iVar13 + uVar22;
    if ((-7 < iVar3) && (iVar3 != -6)) {
      if ((data->m_jacobians).m_capacity < iVar12) {
        if (iVar12 == 0) {
          pfVar14 = (float *)0x0;
        }
        else {
          pfVar14 = (float *)btAlignedAllocInternal((long)iVar12 << 2,0x10);
        }
        lVar15 = (long)(data->m_jacobians).m_size;
        if (0 < lVar15) {
          pfVar5 = (data->m_jacobians).m_data;
          lVar18 = 0;
          do {
            pfVar14[lVar18] = pfVar5[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar15 != lVar18);
        }
        pfVar5 = (data->m_jacobians).m_data;
        if (pfVar5 != (float *)0x0) {
          if ((data->m_jacobians).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar5);
          }
          (data->m_jacobians).m_data = (float *)0x0;
        }
        (data->m_jacobians).m_ownsMemory = true;
        (data->m_jacobians).m_data = pfVar14;
        (data->m_jacobians).m_capacity = iVar12;
      }
      if (iVar3 != -6) {
        memset((data->m_jacobians).m_data + iVar13,0,((long)iVar12 - (long)iVar13) * 4);
      }
    }
    (data->m_jacobians).m_size = iVar12;
    if (jacOrgB == (btScalar *)0x0) {
      uVar23 = *(ulong *)contactNormalOnB->m_floats ^ 0x8000000080000000;
      local_40.m_floats[2] = -contactNormalOnB->m_floats[2];
      local_40.m_floats[0] = (btScalar)(int)uVar23;
      local_40.m_floats[1] = (btScalar)(int)(uVar23 >> 0x20);
      local_40.m_floats[3] = 0.0;
      local_58.m_floats[0] = 0.0;
      local_58.m_floats[1] = 0.0;
      local_58.m_floats[2] = 0.0;
      local_58.m_floats[3] = 0.0;
      btMultiBody::fillConstraintJacobianMultiDof
                (this_01,solverConstraint->m_linkB,posBworld,&local_58,&local_40,
                 (data->m_jacobians).m_data + solverConstraint->m_jacBindex,&data->scratch_r,
                 &data->scratch_v,&data->scratch_m);
    }
    else if (-6 < iVar3) {
      iVar13 = solverConstraint->m_jacBindex;
      uVar23 = 1;
      if (1 < (int)uVar22) {
        uVar23 = (ulong)uVar22;
      }
      pfVar14 = (data->m_jacobians).m_data;
      uVar19 = 0;
      do {
        pfVar14[(long)iVar13 + uVar19] = jacOrgB[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar23 != uVar19);
    }
    lVar15 = (long)(data->m_deltaVelocitiesUnitImpulse).m_size;
    iVar13 = (int)((int)uVar22 + lVar15);
    if ((-7 < iVar3) && (iVar3 != -6)) {
      if ((data->m_deltaVelocitiesUnitImpulse).m_capacity < iVar13) {
        if (iVar13 == 0) {
          pfVar14 = (float *)0x0;
        }
        else {
          pfVar14 = (float *)btAlignedAllocInternal(((int)uVar22 + lVar15) * 4,0x10);
        }
        lVar18 = (long)(data->m_deltaVelocitiesUnitImpulse).m_size;
        if (0 < lVar18) {
          pfVar5 = (data->m_deltaVelocitiesUnitImpulse).m_data;
          lVar20 = 0;
          do {
            pfVar14[lVar20] = pfVar5[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar18 != lVar20);
        }
        pfVar5 = (data->m_deltaVelocitiesUnitImpulse).m_data;
        if (pfVar5 != (float *)0x0) {
          if ((data->m_deltaVelocitiesUnitImpulse).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar5);
          }
          (data->m_deltaVelocitiesUnitImpulse).m_data = (float *)0x0;
        }
        (data->m_deltaVelocitiesUnitImpulse).m_ownsMemory = true;
        (data->m_deltaVelocitiesUnitImpulse).m_data = pfVar14;
        (data->m_deltaVelocitiesUnitImpulse).m_capacity = iVar13;
      }
      if (iVar3 != -6) {
        memset((data->m_deltaVelocitiesUnitImpulse).m_data + lVar15,0,(iVar13 - lVar15) * 4);
      }
    }
    (data->m_deltaVelocitiesUnitImpulse).m_size = iVar13;
    btMultiBody::calcAccelerationDeltasMultiDof
              (this_01,(data->m_jacobians).m_data + solverConstraint->m_jacBindex,
               (data->m_deltaVelocitiesUnitImpulse).m_data + solverConstraint->m_jacBindex,
               &data->scratch_r,&data->scratch_v);
    fVar28 = (float)*(undefined8 *)contactNormalOnB->m_floats;
    fVar32 = (float)((ulong)*(undefined8 *)contactNormalOnB->m_floats >> 0x20);
    fVar26 = local_98._4_4_ * contactNormalOnB->m_floats[2] - fVar32 * in_XMM9_Da;
    fVar27 = in_XMM9_Da * fVar28 - contactNormalOnB->m_floats[2] * (float)local_98;
    fVar28 = (float)local_98 * fVar32 - fVar28 * local_98._4_4_;
  }
  auVar7._8_4_ = -fVar28;
  auVar7._0_8_ = CONCAT44(fVar27,fVar26) ^ 0x8000000080000000;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar7;
  auVar8._8_4_ = -contactNormalOnB->m_floats[2];
  auVar8._0_8_ = *(ulong *)contactNormalOnB->m_floats ^ 0x8000000080000000;
  auVar8._12_4_ = 0;
  *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar8;
  if (this_00 == (btMultiBody *)0x0) {
    if (local_118 == (btRigidBody *)0x0) {
      fVar26 = 0.0;
    }
    else {
      fVar26 = (solverConstraint->m_angularComponentA).m_floats[0];
      fVar27 = (solverConstraint->m_angularComponentA).m_floats[1];
      fVar28 = (solverConstraint->m_angularComponentA).m_floats[2];
      fVar26 = (local_a8._4_4_ * fVar26 - (float)local_a8 * fVar27) * contactNormalOnB->m_floats[2]
               + (fVar27 * fVar25 - local_a8._4_4_ * fVar28) * contactNormalOnB->m_floats[0] +
                 (fVar28 * (float)local_a8 - fVar25 * fVar26) * contactNormalOnB->m_floats[1] +
               local_118->m_inverseMass;
    }
  }
  else {
    fVar26 = 0.0;
    if (-6 < this_00->m_dofCount) {
      iVar13 = this_00->m_dofCount + 5;
      uVar23 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      do {
        fVar26 = fVar26 + (data->m_jacobians).m_data[(long)solverConstraint->m_jacAindex + uVar23] *
                          (data->m_deltaVelocitiesUnitImpulse).m_data
                          [(long)solverConstraint->m_jacAindex + uVar23];
        uVar23 = uVar23 + 1;
      } while (iVar13 + 1 != uVar23);
    }
  }
  if (this_01 == (btMultiBody *)0x0) {
    if (pbVar21 == (btRigidBody *)0x0) {
      fVar27 = 0.0;
    }
    else {
      fVar27 = (solverConstraint->m_angularComponentB).m_floats[0];
      fVar28 = (solverConstraint->m_angularComponentB).m_floats[1];
      fVar32 = (solverConstraint->m_angularComponentB).m_floats[2];
      fVar27 = ((float)local_98 * fVar28 - local_98._4_4_ * fVar27) * contactNormalOnB->m_floats[2]
               + (local_98._4_4_ * fVar32 - fVar28 * in_XMM9_Da) * contactNormalOnB->m_floats[0] +
                 (in_XMM9_Da * fVar27 - fVar32 * (float)local_98) * contactNormalOnB->m_floats[1] +
               pbVar21->m_inverseMass;
    }
  }
  else {
    fVar27 = 0.0;
    if (-6 < this_01->m_dofCount) {
      iVar13 = this_01->m_dofCount + 5;
      uVar23 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      do {
        fVar27 = fVar27 + (data->m_jacobians).m_data[(long)solverConstraint->m_jacBindex + uVar23] *
                          (data->m_deltaVelocitiesUnitImpulse).m_data
                          [(long)solverConstraint->m_jacBindex + uVar23];
        uVar23 = uVar23 + 1;
      } while (iVar13 + 1 != uVar23);
    }
  }
  solverConstraint->m_jacDiagABInv =
       (btScalar)(-(uint)(1.1920929e-07 < fVar26 + fVar27) & (uint)(relaxation / (fVar26 + fVar27)))
  ;
  if (this_00 == (btMultiBody *)0x0) {
    if (local_118 == (btRigidBody *)0x0) {
      fVar25 = 0.0;
    }
    else {
      fVar26 = (local_118->m_angularVelocity).m_floats[0];
      fVar27 = (local_118->m_angularVelocity).m_floats[1];
      fVar28 = (local_118->m_angularVelocity).m_floats[2];
      fVar25 = ((local_a8._4_4_ * fVar26 - (float)local_a8 * fVar27) +
               (local_118->m_linearVelocity).m_floats[2]) *
               (solverConstraint->m_contactNormal1).m_floats[2] +
               ((fVar27 * fVar25 - local_a8._4_4_ * fVar28) +
               (local_118->m_linearVelocity).m_floats[0]) *
               (solverConstraint->m_contactNormal1).m_floats[0] +
               ((fVar28 * (float)local_a8 - fVar25 * fVar26) +
               (local_118->m_linearVelocity).m_floats[1]) *
               (solverConstraint->m_contactNormal1).m_floats[1] + 0.0;
    }
  }
  else {
    fVar25 = 0.0;
    if (-6 < this_00->m_dofCount) {
      iVar13 = this_00->m_dofCount + 5;
      uVar23 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      do {
        fVar25 = fVar25 + (this_00->m_realBuf).m_data[uVar23] *
                          (data->m_jacobians).m_data[(long)solverConstraint->m_jacAindex + uVar23];
        uVar23 = uVar23 + 1;
      } while (iVar13 + 1 != uVar23);
    }
  }
  if (this_01 == (btMultiBody *)0x0) {
    if (pbVar21 != (btRigidBody *)0x0) {
      fVar26 = (pbVar21->m_angularVelocity).m_floats[0];
      fVar27 = (pbVar21->m_angularVelocity).m_floats[1];
      fVar28 = (pbVar21->m_angularVelocity).m_floats[2];
      fVar25 = fVar25 + ((local_98._4_4_ * fVar26 - (float)local_98 * fVar27) +
                        (pbVar21->m_linearVelocity).m_floats[2]) *
                        (solverConstraint->m_contactNormal2).m_floats[2] +
                        ((fVar27 * in_XMM9_Da - local_98._4_4_ * fVar28) +
                        (pbVar21->m_linearVelocity).m_floats[0]) *
                        (solverConstraint->m_contactNormal2).m_floats[0] +
                        ((fVar28 * (float)local_98 - in_XMM9_Da * fVar26) +
                        (pbVar21->m_linearVelocity).m_floats[1]) *
                        (solverConstraint->m_contactNormal2).m_floats[1];
    }
  }
  else if (-6 < this_01->m_dofCount) {
    iVar13 = this_01->m_dofCount + 5;
    uVar23 = 0;
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    do {
      fVar25 = fVar25 + (this_01->m_realBuf).m_data[uVar23] *
                        (data->m_jacobians).m_data[(long)solverConstraint->m_jacBindex + uVar23];
      uVar23 = uVar23 + 1;
    } while (iVar13 + 1 != uVar23);
  }
  fVar26 = 0.0;
  if (!isFriction) {
    fVar26 = posError + (infoGlobal->super_btContactSolverInfoData).m_linearSlop;
  }
  solverConstraint->m_friction = 0.0;
  solverConstraint->m_appliedPushImpulse = 0.0;
  solverConstraint->m_appliedImpulse = 0.0;
  bVar24 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse == 0;
  pbVar1 = &(infoGlobal->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold;
  bVar30 = ((-fVar26 *
            (&(infoGlobal->super_btContactSolverInfoData).m_erp)
            [((NAN(fVar26) || NAN(*pbVar1)) || (*pbVar1 > fVar26 || fVar26 == *pbVar1)) && !bVar24])
           / (infoGlobal->super_btContactSolverInfoData).m_timeStep) *
           solverConstraint->m_jacDiagABInv;
  bVar33 = (desiredVelocity - fVar25) * solverConstraint->m_jacDiagABInv;
  if (*pbVar1 <= fVar26 && fVar26 != *pbVar1 || bVar24) {
    bVar33 = bVar33 + bVar30;
    bVar30 = 0.0;
  }
  solverConstraint->m_rhs = bVar33;
  solverConstraint->m_rhsPenetration = bVar30;
  solverConstraint->m_cfm = 0.0;
  solverConstraint->m_lowerLimit = lowerLimit;
  solverConstraint->m_upperLimit = upperLimit;
  return fVar25;
}

Assistant:

btScalar btMultiBodyConstraint::fillMultiBodyConstraint(	btMultiBodySolverConstraint& solverConstraint,
															btMultiBodyJacobianData& data,
															btScalar* jacOrgA, btScalar* jacOrgB,
															const btVector3& contactNormalOnB,
															const btVector3& posAworld, const btVector3& posBworld,
															btScalar posError,
															const btContactSolverInfo& infoGlobal,
															btScalar lowerLimit, btScalar upperLimit,
															btScalar relaxation,
															bool isFriction, btScalar desiredVelocity, btScalar cfmSlip)
{


	solverConstraint.m_multiBodyA = m_bodyA;
	solverConstraint.m_multiBodyB = m_bodyB;
	solverConstraint.m_linkA = m_linkA;
	solverConstraint.m_linkB = m_linkB;

	btMultiBody* multiBodyA = solverConstraint.m_multiBodyA;
	btMultiBody* multiBodyB = solverConstraint.m_multiBodyB;

	btSolverBody* bodyA = multiBodyA ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdA);
	btSolverBody* bodyB = multiBodyB ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdB);

	btRigidBody* rb0 = multiBodyA ? 0 : bodyA->m_originalBody;
	btRigidBody* rb1 = multiBodyB ? 0 : bodyB->m_originalBody;

	btVector3 rel_pos1, rel_pos2;				//these two used to be inited to posAworld and posBworld (respectively) but it does not seem necessary
	if (bodyA)
		rel_pos1 = posAworld - bodyA->getWorldTransform().getOrigin();
	if (bodyB)
		rel_pos2 = posBworld - bodyB->getWorldTransform().getOrigin();

	if (multiBodyA)
	{
		if (solverConstraint.m_linkA<0)
		{
			rel_pos1 = posAworld - multiBodyA->getBasePos();
		} else
		{
			rel_pos1 = posAworld - multiBodyA->getLink(solverConstraint.m_linkA).m_cachedWorldTransform.getOrigin();
		}

		const int ndofA  = multiBodyA->getNumDofs() + 6;

		solverConstraint.m_deltaVelAindex = multiBodyA->getCompanionId();

		if (solverConstraint.m_deltaVelAindex <0)
		{
			solverConstraint.m_deltaVelAindex = data.m_deltaVelocities.size();
			multiBodyA->setCompanionId(solverConstraint.m_deltaVelAindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofA);
		} else
		{
			btAssert(data.m_deltaVelocities.size() >= solverConstraint.m_deltaVelAindex+ndofA);
		}

		//determine jacobian of this 1D constraint in terms of multibodyA's degrees of freedom
		//resize..
		solverConstraint.m_jacAindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofA);
		//copy/determine
		if(jacOrgA)
		{
			for (int i=0;i<ndofA;i++)
				data.m_jacobians[solverConstraint.m_jacAindex+i] = jacOrgA[i];
		}
		else
		{
			btScalar* jac1=&data.m_jacobians[solverConstraint.m_jacAindex];
			multiBodyA->fillContactJacobianMultiDof(solverConstraint.m_linkA, posAworld, contactNormalOnB, jac1, data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine the velocity response of multibodyA to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofA);		//=> each constraint row has the constrained tree dofs allocated in m_deltaVelocitiesUnitImpulse
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
		//determine..
		multiBodyA->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacAindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}
	else //if(rb0)
	{
		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_angularComponentA = rb0 ? rb0->getInvInertiaTensorWorld()*torqueAxis0*rb0->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}

	if (multiBodyB)
	{
		if (solverConstraint.m_linkB<0)
		{
			rel_pos2 = posBworld - multiBodyB->getBasePos();
		} else
		{
			rel_pos2 = posBworld - multiBodyB->getLink(solverConstraint.m_linkB).m_cachedWorldTransform.getOrigin();
		}

		const int ndofB  = multiBodyB->getNumDofs() + 6;

		solverConstraint.m_deltaVelBindex = multiBodyB->getCompanionId();
		if (solverConstraint.m_deltaVelBindex <0)
		{
			solverConstraint.m_deltaVelBindex = data.m_deltaVelocities.size();
			multiBodyB->setCompanionId(solverConstraint.m_deltaVelBindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofB);
		}

		//determine jacobian of this 1D constraint in terms of multibodyB's degrees of freedom
		//resize..
		solverConstraint.m_jacBindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofB);
		//copy/determine..
		if(jacOrgB)
		{
			for (int i=0;i<ndofB;i++)
				data.m_jacobians[solverConstraint.m_jacBindex+i] = jacOrgB[i];
		}
		else
		{
			multiBodyB->fillContactJacobianMultiDof(solverConstraint.m_linkB, posBworld, -contactNormalOnB, &data.m_jacobians[solverConstraint.m_jacBindex], data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine velocity response of multibodyB to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofB);
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
		//determine..
		multiBodyB->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacBindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;

	}
	else //if(rb1)
	{
		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_angularComponentB = rb1 ? rb1->getInvInertiaTensorWorld()*-torqueAxis1*rb1->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;
	}
	{

		btVector3 vec;
		btScalar denom0 = 0.f;
		btScalar denom1 = 0.f;
		btScalar* jacB = 0;
		btScalar* jacA = 0;
		btScalar* deltaVelA = 0;
		btScalar* deltaVelB = 0;
		int ndofA  = 0;
		//determine the "effective mass" of the constrained multibodyA with respect to this 1D constraint (i.e. 1/A[i,i])
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			deltaVelA = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA; ++i)
			{
				btScalar j = jacA[i] ;
				btScalar l = deltaVelA[i];
				denom0 += j*l;
			}
		}
		else if(rb0)
		{
			vec = ( solverConstraint.m_angularComponentA).cross(rel_pos1);
			denom0 = rb0->getInvMass() + contactNormalOnB.dot(vec);
		}
		//
		if (multiBodyB)
		{
			const int ndofB = multiBodyB->getNumDofs() + 6;
			jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			deltaVelB = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB; ++i)
			{
				btScalar j = jacB[i] ;
				btScalar l = deltaVelB[i];
				denom1 += j*l;
			}

		}
		else if(rb1)
		{
			vec = ( -solverConstraint.m_angularComponentB).cross(rel_pos2);
			denom1 = rb1->getInvMass() + contactNormalOnB.dot(vec);
		}

		//
		btScalar d = denom0+denom1;
		if (d>SIMD_EPSILON)
		{
			solverConstraint.m_jacDiagABInv = relaxation/(d);
		}
		else
		{
		//disable the constraint row to handle singularity/redundant constraint
			solverConstraint.m_jacDiagABInv  = 0.f;
		}
	}


	//compute rhs and remaining solverConstraint fields
	btScalar penetration = isFriction? 0 : posError+infoGlobal.m_linearSlop;

	btScalar rel_vel = 0.f;
	int ndofA  = 0;
	int ndofB  = 0;
	{
		btVector3 vel1,vel2;
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			btScalar* jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA ; ++i)
				rel_vel += multiBodyA->getVelocityVector()[i] * jacA[i];
		}
		else if(rb0)
		{
			rel_vel += rb0->getVelocityInLocalPoint(rel_pos1).dot(solverConstraint.m_contactNormal1);
		}
		if (multiBodyB)
		{
			ndofB = multiBodyB->getNumDofs() + 6;
			btScalar* jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB ; ++i)
				rel_vel += multiBodyB->getVelocityVector()[i] * jacB[i];

		}
		else if(rb1)
		{
			rel_vel += rb1->getVelocityInLocalPoint(rel_pos2).dot(solverConstraint.m_contactNormal2);
		}

		solverConstraint.m_friction = 0.f;//cp.m_combinedFriction;
	}


	///warm starting (or zero if disabled)
	/*
	if (infoGlobal.m_solverMode & SOLVER_USE_WARMSTARTING)
	{
		solverConstraint.m_appliedImpulse = isFriction ? 0 : cp.m_appliedImpulse * infoGlobal.m_warmstartingFactor;

		if (solverConstraint.m_appliedImpulse)
		{
			if (multiBodyA)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
				multiBodyA->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelAindex,ndofA);
			} else
			{
				if (rb0)
					bodyA->internalApplyImpulse(solverConstraint.m_contactNormal1*bodyA->internalGetInvMass()*rb0->getLinearFactor(),solverConstraint.m_angularComponentA,solverConstraint.m_appliedImpulse);
			}
			if (multiBodyB)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
				multiBodyB->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelBindex,ndofB);
			} else
			{
				if (rb1)
					bodyB->internalApplyImpulse(-solverConstraint.m_contactNormal2*bodyB->internalGetInvMass()*rb1->getLinearFactor(),-solverConstraint.m_angularComponentB,-(btScalar)solverConstraint.m_appliedImpulse);
			}
		}
	} else
	*/

	solverConstraint.m_appliedImpulse = 0.f;
	solverConstraint.m_appliedPushImpulse = 0.f;

	{

		btScalar positionalError = 0.f;
		btScalar	velocityError = desiredVelocity - rel_vel;// * damping;


		btScalar erp = infoGlobal.m_erp2;
		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			erp = infoGlobal.m_erp;
		}

		positionalError = -penetration * erp/infoGlobal.m_timeStep;

		btScalar  penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
		btScalar velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;

		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			//combine position and velocity into rhs
			solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
			solverConstraint.m_rhsPenetration = 0.f;

		} else
		{
			//split position and velocity into rhs and m_rhsPenetration
			solverConstraint.m_rhs = velocityImpulse;
			solverConstraint.m_rhsPenetration = penetrationImpulse;
		}

		solverConstraint.m_cfm = 0.f;
		solverConstraint.m_lowerLimit = lowerLimit;
		solverConstraint.m_upperLimit = upperLimit;
	}

	return rel_vel;

}